

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixFileSize(sqlite3_file *id,i64 *pSize)

{
  int iVar1;
  int *piVar2;
  i64 iVar3;
  long in_FS_OFFSET;
  stat buf;
  undefined1 local_b0 [48];
  long local_80;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_b0,0xaa,0x90);
  iVar1 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_b0);
  if (iVar1 == 0) {
    iVar1 = 0;
    iVar3 = 0;
    if (local_80 != 1) {
      iVar3 = local_80;
    }
    *pSize = iVar3;
  }
  else {
    piVar2 = __errno_location();
    *(int *)&id[4].pMethods = *piVar2;
    iVar1 = 0x70a;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

static int unixFileSize(sqlite3_file *id, i64 *pSize){
  int rc;
  struct stat buf;
  assert( id );
  rc = osFstat(((unixFile*)id)->h, &buf);
  SimulateIOError( rc=1 );
  if( rc!=0 ){
    storeLastErrno((unixFile*)id, errno);
    return SQLITE_IOERR_FSTAT;
  }
  *pSize = buf.st_size;

  /* When opening a zero-size database, the findInodeInfo() procedure
  ** writes a single byte into that file in order to work around a bug
  ** in the OS-X msdos filesystem.  In order to avoid problems with upper
  ** layers, we need to report this file size as zero even though it is
  ** really 1.   Ticket #3260.
  */
  if( *pSize==1 ) *pSize = 0;


  return SQLITE_OK;
}